

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
external_distance_sensor_message_write_read::test_method
          (external_distance_sensor_message_write_read *this)

{
  unit_test_log_t *this_00;
  bool bVar1;
  reference pvVar2;
  lazy_ostream *prev;
  basic_cstring<const_char> local_198;
  basic_cstring<const_char> local_188;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_178;
  undefined1 local_151 [9];
  binary_expr<boost::test_tools::assertion::value_expr<double_&>,_double_&,_boost::test_tools::assertion::op::EQ<double,_double,_void>_>
  local_148;
  assertion_result local_138;
  basic_cstring<const_char> local_120;
  basic_cstring<const_char> local_110;
  int local_fc;
  undefined1 local_f8 [4];
  int i_1;
  buffer_reader reader;
  external_distance_sensor_message read_msg;
  undefined1 local_88 [8];
  buffer_writer writer;
  buffer buffer;
  undefined1 local_58 [4];
  int i;
  external_distance_sensor_message write_msg;
  external_distance_sensor_message_write_read *this_local;
  
  write_msg.data._M_elems[8] = (double)this;
  for (buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < 9;
      buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    pvVar2 = std::array<double,_9UL>::operator[]
                       ((array<double,_9UL> *)local_58,
                        (long)buffer.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    *pvVar2 = (double)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 0.3;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&writer._start);
  buffer_writer::buffer_writer((buffer_writer *)local_88,(buffer *)&writer._start);
  ::operator<<((buffer_writer *)local_88,(external_distance_sensor_message *)local_58);
  buffer_reader::buffer_reader((buffer_reader *)local_f8,(buffer *)&writer._start);
  ::operator>>((buffer_reader *)local_f8,
               (external_distance_sensor_message *)((long)&reader._index + 4));
  for (local_fc = 0; local_fc < 9; local_fc = local_fc + 1) {
    do {
      this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_110,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
                 ,0x60);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_120);
      boost::unit_test::unit_test_log_t::set_checkpoint(this_00,&local_110,0xb4,&local_120);
      std::array<double,_9UL>::operator[]
                ((array<double,_9UL> *)((long)&reader._index + 4),(long)local_fc);
      boost::test_tools::assertion::seed::operator->*((seed *)(local_151 + 1),(double *)local_151);
      std::array<double,_9UL>::operator[]((array<double,_9UL> *)local_58,(long)local_fc);
      boost::test_tools::assertion::
      expression_base<boost::test_tools::assertion::value_expr<double&>,double>::operator==
                ((expression_base<boost::test_tools::assertion::value_expr<double&>,double> *)
                 &local_148,(double *)(local_151 + 1));
      boost::test_tools::assertion::
      binary_expr<boost::test_tools::assertion::value_expr<double_&>,_double_&,_boost::test_tools::assertion::op::EQ<double,_double,_void>_>
      ::evaluate(&local_138,&local_148,false);
      prev = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_188,"read_msg.data[i] == write_msg.data[i]",0x25);
      boost::unit_test::operator<<(&local_178,prev,&local_188);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_198,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
                 ,0x60);
      boost::test_tools::tt_detail::report_assertion
                (&local_138,&local_178.super_lazy_ostream,&local_198,0xb4,CHECK,
                 CHECK_BUILT_ASSERTION,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(&local_178);
      boost::test_tools::assertion_result::~assertion_result(&local_138);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&writer._start);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(external_distance_sensor_message_write_read)
{
    external_distance_sensor_message write_msg;
    for(int i = 0; i<9; i++){
      write_msg.data[i] = static_cast<double>(i) + 0.3;
    }

    buffer buffer;
    buffer_writer writer(buffer);
    writer << write_msg;

    external_distance_sensor_message read_msg;
    buffer_reader reader(buffer);
    reader >> read_msg;

    for(int i = 0; i<9; i++){
      BOOST_TEST(read_msg.data[i] == write_msg.data[i]);
    }
}